

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O1

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this,
          MatrixType *matrix)

{
  NCMatrix *this_00;
  string *psVar1;
  GlobalLU_t *glu;
  undefined4 *puVar2;
  long lVar3;
  uint m;
  Index IVar4;
  Index *pIVar5;
  Index *pIVar6;
  Index *pIVar7;
  PermutationType *pPVar8;
  uint uVar9;
  long lVar10;
  DenseStorage<double,__1,__1,_1,_0> DVar11;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_01;
  byte bVar12;
  int iVar13;
  Index *pIVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  undefined8 *puVar19;
  uint uVar20;
  ulong uVar21;
  int *piVar22;
  char *pcVar23;
  Index othersize_5;
  int *piVar24;
  uint uVar25;
  int iVar26;
  Index alignedEnd;
  long lVar27;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *pSVar28;
  ulong uVar29;
  Index othersize_7;
  int *piVar30;
  Index othersize_3;
  long lVar31;
  undefined1 local_410 [8];
  ostringstream returnInfo;
  ios_base local_3a0 [264];
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  double *local_258;
  int *piStack_250;
  int *local_238;
  ulong uStack_230;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  double *local_1d8;
  int *piStack_1d0;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [8];
  PermutationType iperm_c;
  undefined1 local_180 [16];
  long local_170;
  long local_168;
  RealScalar *local_160;
  MatrixType *local_158;
  Matrix<int,__1,_1,_0,__1,_1> *local_150;
  Matrix<int,__1,_1,_0,__1,_1> *local_148;
  Matrix<int,__1,_1,_0,__1,_1> *local_140;
  int local_138;
  uint local_134;
  Index pivrow;
  int *local_128;
  IndexVector local_120;
  undefined1 local_110 [8];
  IndexVector relax_end;
  IndexVector xprune;
  IndexVector panel_lsub;
  IndexVector repfnz;
  DenseStorage<double,__1,__1,_1,_0> local_c8;
  IndexVector local_b8;
  DenseStorage<double,__1,__1,_1,_0> local_a8;
  int local_8c;
  undefined1 auStack_88 [4];
  Index nseg1;
  IndexVector segrep;
  int local_5c;
  int *piStack_58;
  Index nseg;
  Index othersize;
  uint local_44;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *local_40;
  byte local_31;
  
  local_40 = this;
  if (this->m_analysisIsOk == false) {
    __assert_fail("m_analysisIsOk && \"analyzePattern() should be called first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c8,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  if (matrix->m_innerSize != matrix->m_outerSize) {
    __assert_fail("(matrix.rows() == matrix.cols()) && \"Only for squared matrices\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c9,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  this_00 = &this->m_mat;
  SparseMatrix<double,_0,_int>::operator=(this_00,matrix);
  if ((int)(this->m_perm_c).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows == 0) {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&this->m_perm_c,
               (long)matrix->m_outerSize);
    if (0 < matrix->m_outerSize) {
      piVar30 = (local_40->m_perm_c).m_indices.
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar31 = (local_40->m_perm_c).m_indices.
               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar27 = 0;
      if (lVar31 < 1) {
        lVar31 = lVar27;
      }
      do {
        if (lVar31 == lVar27) goto LAB_0014783f;
        piVar30[lVar27] = (int)lVar27;
        lVar27 = lVar27 + 1;
      } while (lVar27 < matrix->m_outerSize);
    }
  }
  else {
    SparseMatrix<double,_0,_int>::uncompress(this_00);
    pIVar5 = matrix->m_innerNonZeros;
    if (pIVar5 == (Index *)0x0) {
      pIVar14 = matrix->m_outerIndex;
    }
    else {
      uVar25 = matrix->m_outerSize;
      lVar31 = (long)(int)uVar25;
      uVar29 = 0xffffffffffffffff;
      if (-2 < lVar31) {
        uVar29 = lVar31 * 4 + 4;
      }
      pIVar14 = (Index *)operator_new__(uVar29);
      if (-1 < lVar31) {
        pIVar6 = (local_40->m_mat).m_outerIndex;
        lVar31 = 0;
        do {
          pIVar14[lVar31] = pIVar6[lVar31];
          lVar31 = lVar31 + 1;
        } while ((ulong)uVar25 + 1 != lVar31);
      }
    }
    if (0 < matrix->m_outerSize) {
      lVar27 = (local_40->m_perm_c).m_indices.
               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pIVar6 = (local_40->m_mat).m_outerIndex;
      pIVar7 = (local_40->m_mat).m_innerNonZeros;
      piVar30 = (local_40->m_perm_c).m_indices.
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar31 = 0;
      if (lVar27 < 1) {
        lVar27 = lVar31;
      }
      do {
        if (lVar27 == lVar31) goto LAB_0014783f;
        pIVar6[piVar30[lVar31]] = pIVar14[lVar31];
        lVar3 = lVar31 + 1;
        piVar15 = pIVar14 + lVar31;
        piVar22 = piVar30 + lVar31;
        lVar31 = lVar31 + 1;
        pIVar7[*piVar22] = pIVar14[lVar3] - *piVar15;
      } while (lVar31 < matrix->m_outerSize);
    }
    if ((pIVar5 != (Index *)0x0) && (pIVar14 != (Index *)0x0)) {
      operator_delete__(pIVar14);
    }
  }
  pSVar28 = local_40;
  uVar25 = (local_40->m_mat).m_outerSize;
  m = (local_40->m_mat).m_innerSize;
  uVar29 = (ulong)m;
  piVar30 = (int *)(long)(int)uVar25;
  pPVar8 = (PermutationType *)(local_40->m_mat).m_innerNonZeros;
  local_158 = this_00;
  local_44 = uVar25;
  if (pPVar8 == (PermutationType *)0x0) {
    iVar13 = (int)(local_40->m_mat).m_data.m_size;
  }
  else {
    local_410 = (undefined1  [8])pPVar8;
    _returnInfo = (long)piVar30;
    if ((int)uVar25 < 0) {
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                    ,0x8a,
                    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<int, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<int, -1, 1>>, Level = 0]"
                   );
    }
    if (uVar25 == 0) {
      iVar13 = 0;
    }
    else {
      iVar13 = internal::
               redux_impl<Eigen::internal::scalar_sum_op<int>,_Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_0>
               ::run((Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                     local_410,
                     (scalar_sum_op<int> *)
                     &iperm_c.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows);
    }
  }
  uVar20 = (pSVar28->m_perfv).panel_size;
  uVar21 = (ulong)uVar20;
  glu = &pSVar28->m_glu;
  iVar13 = internal::SparseLUImpl<double,_int>::memInit
                     ((SparseLUImpl<double,_int> *)pSVar28,m,local_44,iVar13,0,
                      (pSVar28->m_perfv).fillfactor,uVar20,glu);
  if (iVar13 != 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&pSVar28->m_lastError,0,(char *)(pSVar28->m_lastError)._M_string_length,
               0x19d39e);
    pSVar28->m_factorizationIsOk = false;
    return;
  }
  piVar15 = (int *)(long)(int)m;
  piStack_58 = piVar15;
  othersize = uVar21;
  if (m == 0) {
    _auStack_88 = (int *)0x0;
  }
  else if (((int)m < 0) ||
          (_auStack_88 = (int *)malloc((long)piVar15 * 4), _auStack_88 == (int *)0x0)) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar19 = std::streambuf::xsgetn;
    __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = piVar15;
  if (-1 < (int)m) {
    uVar21 = (ulong)(m & 0x7ffffffc);
    if (3 < (int)m) {
      uVar16 = 0;
      do {
        *(undefined1 (*) [16])(_auStack_88 + uVar16) = (undefined1  [16])0x0;
        uVar16 = uVar16 + 4;
      } while (uVar16 < uVar21);
    }
    uVar16 = (ulong)piStack_58 >> 2;
    if ((long)uVar21 < (long)piStack_58) {
      memset(_auStack_88 + uVar16 * 4,0,(long)piStack_58 * 4 + uVar16 * -0x10);
    }
    piVar15 = piStack_58;
    if (m == 0) {
      _pivrow = (int *)0x0;
    }
    else {
      _pivrow = (int *)malloc((long)piStack_58 * 4);
      if (_pivrow == (int *)0x0) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = std::streambuf::xsgetn;
        __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    local_128 = piVar15;
    if (3 < (int)m) {
      uVar17 = 0;
      do {
        *(undefined1 (*) [16])(_pivrow + uVar17) = (undefined1  [16])0x0;
        uVar17 = uVar17 + 4;
      } while (uVar17 < uVar21);
    }
    if ((long)uVar21 < (long)piStack_58) {
      memset(_pivrow + uVar16 * 4,0,(long)piStack_58 * 4 + uVar16 * -0x10);
    }
    piVar15 = piStack_58;
    if (m == 0) {
      local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (int *)0x0;
    }
    else {
      local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (int *)malloc((long)piStack_58 * 4);
      if (local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
          (int *)0x0) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = std::streambuf::xsgetn;
        __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (DenseIndex)piVar15;
    if (3 < (int)m) {
      uVar17 = 0;
      do {
        *(undefined1 (*) [16])
         (local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
         uVar17) = (undefined1  [16])0x0;
        uVar17 = uVar17 + 4;
      } while (uVar17 < uVar21);
    }
    othersize = (Index)((int)othersize * m);
    if ((long)uVar21 < (long)piStack_58) {
      memset(local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
             + uVar16 * 4,0,(long)piStack_58 * 4 + uVar16 * -0x10);
    }
    iVar13 = (int)othersize;
    piVar15 = (int *)(long)iVar13;
    if (iVar13 == 0) {
      panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    }
    else if ((iVar13 < 0) ||
            (panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  = (DenseIndex)malloc((long)piVar15 * 4),
            (void *)panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows == (void *)0x0)) {
      puVar19 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar19 = std::streambuf::xsgetn;
      __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if (-1 < iVar13) {
      if (iVar13 == 0) {
        xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      }
      else {
        xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (DenseIndex)malloc((long)piVar15 * 4);
        if ((void *)xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows == (void *)0x0) {
          puVar19 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar19 = std::streambuf::xsgetn;
          __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           piVar15;
      if (local_44 == 0) {
        relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      }
      else if (((int)local_44 < 0) ||
              (relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows = (DenseIndex)malloc((long)piVar30 * 4),
              (void *)relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows == (void *)0x0)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = std::streambuf::xsgetn;
        __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = piVar30;
      if (-1 < (int)local_44) {
        if (3 < (int)local_44) {
          uVar21 = 0;
          do {
            *(undefined1 (*) [16])
             (relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             + uVar21 * 4) = (undefined1  [16])0x0;
            uVar21 = uVar21 + 4;
          } while (uVar21 < (uVar25 & 0x7ffffffc));
        }
        if ((long)(ulong)(uVar25 & 0x7ffffffc) < (long)piVar30) {
          uVar21 = (long)piVar30 * 4 & 0x1fffffff0;
          memset((void *)(uVar21 + relax_end.
                                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows),0,(long)piVar30 * 4 - uVar21);
        }
        uVar21 = uVar29 * 3;
        if (m == 0) {
          local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (int *)0x0;
        }
        else {
          local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (int *)malloc(uVar29 * 0xc);
          if (local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
              == (int *)0x0) {
            puVar19 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar19 = std::streambuf::xsgetn;
            __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
        uVar16 = (ulong)((uint)uVar21 & 0x7ffffffc);
        if (1 < m) {
          uVar17 = 0;
          do {
            *(undefined1 (*) [16])
             (local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
             + uVar17) = (undefined1  [16])0x0;
            uVar17 = uVar17 + 4;
          } while (uVar17 < uVar16);
        }
        local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar21;
        if (uVar16 != uVar21) {
          uVar21 = uVar29 * 0xc & 0x1fffffff0;
          memset((void *)(uVar21 + (long)local_b8.
                                         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data),0,uVar29 * 0xc - uVar21);
        }
        pSVar28 = local_40;
        if (-1 < (long)piVar15) {
          if (3 < (long)piVar15) {
            uVar21 = 0;
            do {
              puVar2 = (undefined4 *)
                       (panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows + uVar21 * 4);
              *puVar2 = 0xffffffff;
              puVar2[1] = 0xffffffff;
              puVar2[2] = 0xffffffff;
              puVar2[3] = 0xffffffff;
              uVar21 = uVar21 + 4;
            } while (uVar21 < ((ulong)piVar15 & 0x7ffffffffffffffc));
          }
          if ((long)((ulong)piVar15 & 0x7ffffffffffffffc) < (long)piVar15) {
            memset((void *)(((long)piVar15 << 2 & 0xfffffffffffffff0U) +
                           panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows),0xff,(ulong)((uint)((long)piVar15 << 2) & 0xc));
          }
          if (-1 < (long)panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data) {
            if (3 < (long)panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data) {
              uVar21 = 0;
              do {
                puVar2 = (undefined4 *)
                         (xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows + uVar21 * 4);
                *puVar2 = 0xffffffff;
                puVar2[1] = 0xffffffff;
                puVar2[2] = 0xffffffff;
                puVar2[3] = 0xffffffff;
                uVar21 = uVar21 + 4;
              } while (uVar21 < ((ulong)panel_lsub.
                                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                        m_storage.m_data & 0x7ffffffffffffffc));
            }
            if ((long)((ulong)panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                              .m_storage.m_data & 0x7ffffffffffffffc) <
                (long)panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data) {
              memset((void *)(((long)panel_lsub.
                                     super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data << 2 & 0xfffffffffffffff0U) +
                             xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows),0xff,
                     (ulong)((uint)((long)panel_lsub.
                                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data << 2) & 0xc));
            }
            local_a8.m_data = (double *)0x0;
            local_a8.m_rows = 0;
            DVar11 = local_a8;
            local_a8.m_data = (double *)0x0;
            pdVar18 = local_a8.m_data;
            if (piVar15 != (int *)0x0) {
              local_a8 = DVar11;
              free((void *)0x0);
              if ((int)othersize == 0) {
                local_a8.m_data = (double *)0x0;
                pdVar18 = local_a8.m_data;
              }
              else {
                pdVar18 = (double *)malloc((long)piVar15 * 8);
                if (pdVar18 == (double *)0x0) {
                  puVar19 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar19 = std::streambuf::xsgetn;
                  __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
              }
            }
            local_a8.m_data = pdVar18;
            local_a8.m_rows = (DenseIndex)piVar15;
            uVar21 = (ulong)((uint)othersize & 0x7ffffffe);
            if (1 < (int)(uint)othersize) {
              uVar16 = 0;
              do {
                *(undefined1 (*) [16])(local_a8.m_data + uVar16) = (undefined1  [16])0x0;
                uVar16 = uVar16 + 2;
              } while (uVar16 < uVar21);
            }
            if ((long)uVar21 < (long)piVar15) {
              uVar21 = (long)piVar15 * 8 & 0x3fffffff0;
              memset((void *)(uVar21 + (long)local_a8.m_data),0,(long)piVar15 * 8 - uVar21);
            }
            local_c8.m_data = (double *)0x0;
            local_c8.m_rows = 0;
            DVar11 = local_c8;
            local_c8.m_data = (double *)0x0;
            uVar25 = ((pSVar28->m_perfv).maxsuper + m) * (pSVar28->m_perfv).panel_size;
            if ((int)uVar25 < (int)m) {
              uVar25 = m;
            }
            uVar21 = (ulong)uVar25;
            pdVar18 = local_c8.m_data;
            if (uVar21 != 0) {
              local_c8 = DVar11;
              free((void *)0x0);
              if (uVar21 == 0) {
                local_c8.m_data = (double *)0x0;
                pdVar18 = local_c8.m_data;
              }
              else {
                pdVar18 = (double *)malloc(uVar21 * 8);
                if (pdVar18 == (double *)0x0) {
                  puVar19 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar19 = std::streambuf::xsgetn;
                  __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
              }
            }
            local_c8.m_data = pdVar18;
            local_c8.m_rows._0_4_ = uVar25;
            local_c8.m_rows._4_4_ = 0;
            if (1 < uVar25) {
              uVar16 = 0;
              do {
                *(undefined1 (*) [16])(local_c8.m_data + uVar16) = (undefined1  [16])0x0;
                uVar16 = uVar16 + 2;
              } while (uVar16 < (uVar25 & 0x7ffffffe));
            }
            if ((uVar25 & 0x7ffffffe) != uVar25) {
              uVar16 = uVar21 * 8 & 0x3fffffff0;
              memset((void *)(uVar16 + (long)local_c8.m_data),0,uVar21 * 8 - uVar16);
            }
            local_410 = (undefined1  [8])&this->m_perm_c;
            PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
                      ((PermutationMatrix<_1,_1,int> *)local_1a0,
                       (Transpose<Eigen::PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_>_> *
                       )local_410);
            pSVar28 = local_40;
            if (local_44 == 0) {
              local_110 = (undefined1  [8])0x0;
            }
            else {
              local_110 = (undefined1  [8])malloc((long)piVar30 * 4);
              if (local_110 == (undefined1  [8])0x0) {
                puVar19 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar19 = std::streambuf::xsgetn;
                __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
            }
            iVar13 = (pSVar28->m_perfv).relax;
            relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 piVar30;
            if (pSVar28->m_symmetricmode == true) {
              internal::SparseLUImpl<double,_int>::heap_relax_snode
                        ((SparseLUImpl<double,_int> *)pSVar28,local_44,&pSVar28->m_etree,iVar13,
                         &local_b8,(IndexVector *)local_110);
            }
            else {
              internal::SparseLUImpl<double,_int>::relax_snode
                        ((SparseLUImpl<double,_int> *)pSVar28,local_44,&pSVar28->m_etree,iVar13,
                         &local_b8,(IndexVector *)local_110);
            }
            pPVar8 = &pSVar28->m_perm_r;
            PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)pPVar8,
                       (Index)piStack_58);
            uVar21 = (pSVar28->m_perm_r).m_indices.
                     super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
            if (-1 < (long)uVar21) {
              PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)pPVar8,uVar21,1);
              pSVar28 = local_40;
              uVar16 = (local_40->m_perm_r).m_indices.
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
              if (uVar16 != uVar21) {
LAB_0014796b:
                __assert_fail("rows() == other.rows() && cols() == other.cols()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                              ,0x1f2,
                              "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
                             );
              }
              uVar21 = uVar16 + 3;
              if (-1 < (long)uVar16) {
                uVar21 = uVar16;
              }
              if (3 < (long)uVar16) {
                lVar31 = 0;
                do {
                  piVar22 = (pPVar8->m_indices).
                            super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                            m_data + lVar31;
                  *piVar22 = -1;
                  piVar22[1] = -1;
                  piVar22[2] = -1;
                  piVar22[3] = -1;
                  lVar31 = lVar31 + 4;
                } while (lVar31 < (long)(uVar21 & 0xfffffffffffffffc));
              }
              if ((long)(uVar21 & 0xfffffffffffffffc) < (long)uVar16) {
                memset((pPVar8->m_indices).
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
                       + ((long)uVar21 >> 2) * 4,0xff,uVar16 * 4 + ((long)uVar21 >> 2) * -0x10);
              }
              if (-1 < local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows) {
                if (3 < local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows) {
                  uVar21 = 0;
                  do {
                    piVar22 = local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + uVar21;
                    *piVar22 = -1;
                    piVar22[1] = -1;
                    piVar22[2] = -1;
                    piVar22[3] = -1;
                    uVar21 = uVar21 + 4;
                  } while (uVar21 < (local_b8.
                                     super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows & 0x7ffffffffffffffcU));
                }
                if ((long)(local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows & 0x7ffffffffffffffcU) <
                    local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
                  memset((void *)((local_b8.
                                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows << 2 & 0xfffffffffffffff0U) +
                                 (long)local_b8.
                                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                       m_storage.m_data),0xff,
                         (ulong)((uint)(local_b8.
                                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                        m_storage.m_rows << 2) & 0xc));
                }
                uVar25 = local_44;
                pSVar28->m_detPermR = 1;
                if (0 < (pSVar28->m_glu).supno.
                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ) {
                  *(pSVar28->m_glu).supno.
                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = -1
                  ;
                  uVar21 = (pSVar28->m_glu).xsup.
                           super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
                  if ((long)uVar21 < 0) goto LAB_0014794c;
                  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
                            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)glu,uVar21,1);
                  pSVar28 = local_40;
                  uVar16 = (local_40->m_glu).xsup.
                           super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
                  if (uVar16 != uVar21) goto LAB_0014796b;
                  uVar21 = uVar16 + 3;
                  if (-1 < (long)uVar16) {
                    uVar21 = uVar16;
                  }
                  if (3 < (long)uVar16) {
                    lVar31 = 0;
                    do {
                      *(undefined1 (*) [16])
                       ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data + lVar31) = (undefined1  [16])0x0;
                      lVar31 = lVar31 + 4;
                    } while (lVar31 < (long)(uVar21 & 0xfffffffffffffffc));
                  }
                  if ((long)(uVar21 & 0xfffffffffffffffc) < (long)uVar16) {
                    memset((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data + ((long)uVar21 >> 2) * 4,0,
                           uVar16 * 4 + ((long)uVar21 >> 2) * -0x10);
                  }
                  if ((((0 < (pSVar28->m_glu).xlusup.
                             super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                             m_rows) &&
                       (*(pSVar28->m_glu).xlusup.
                         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data = 0,
                       0 < (pSVar28->m_glu).xusub.
                           super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows)) &&
                      (*(pSVar28->m_glu).xusub.
                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
                            = 0,
                      0 < (pSVar28->m_glu).xlsub.
                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows)) &&
                     (*(pSVar28->m_glu).xlsub.
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
                           = 0,
                     0 < (pSVar28->m_glu).xsup.
                         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows)) {
                    *(glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data = 0;
                    if (uVar25 == 0) {
                      segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows = 0;
                    }
                    else {
                      segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows = (DenseIndex)malloc((long)piVar30 << 2);
                      if ((void *)segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                  .m_storage.m_rows == (void *)0x0) {
                        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar19 = std::streambuf::xsgetn;
                        __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                      }
                    }
                    local_150 = &(pSVar28->m_glu).supno;
                    local_140 = &(pSVar28->m_glu).xlusup;
                    local_148 = &(pSVar28->m_glu).xlsub;
                    local_160 = &pSVar28->m_diagpivotthresh;
                    psVar1 = &pSVar28->m_lastError;
                    uVar20 = 0;
                    do {
                      this_01 = local_40;
                      if ((int)uVar25 <= (int)uVar20) {
                        internal::SparseLUImpl<double,_int>::countnz
                                  ((SparseLUImpl<double,_int> *)pSVar28,uVar25,&pSVar28->m_nnzL,
                                   &pSVar28->m_nnzU,glu);
                        internal::SparseLUImpl<double,_int>::fixupL
                                  ((SparseLUImpl<double,_int> *)pSVar28,uVar25,&pPVar8->m_indices,
                                   glu);
                        internal::MappedSuperNodalMatrix<double,_int>::setInfos
                                  (&pSVar28->m_Lstore,m,uVar25,&(pSVar28->m_glu).lusup,local_140,
                                   &(pSVar28->m_glu).lsub,local_148,local_150,&glu->xsup);
                        IVar4 = pSVar28->m_nnzU;
                        piVar30 = (pSVar28->m_glu).xusub.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                        pdVar18 = (pSVar28->m_glu).ucol.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                        piVar15 = (pSVar28->m_glu).usub.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                        (pSVar28->m_Ustore).
                        super_SparseMatrixBase<Eigen::MappedSparseMatrix<double,_0,_int>_>.
                        m_isRValue = false;
                        (pSVar28->m_Ustore).m_outerSize = uVar25;
                        (pSVar28->m_Ustore).m_innerSize = m;
                        (pSVar28->m_Ustore).m_nnz = IVar4;
                        (pSVar28->m_Ustore).m_outerIndex = piVar30;
                        (pSVar28->m_Ustore).m_innerIndices = piVar15;
                        (pSVar28->m_Ustore).m_values = pdVar18;
                        pSVar28->m_info = Success;
                        pSVar28->m_factorizationIsOk = true;
                        break;
                      }
                      othersize = (Index)uVar20;
                      iVar13 = (pSVar28->m_perfv).panel_size;
                      uVar9 = iVar13 + uVar20;
                      if ((int)uVar25 < (int)(iVar13 + uVar20)) {
                        uVar9 = uVar25;
                      }
                      lVar27 = (long)(int)uVar20;
                      lVar31 = 0;
                      do {
                        lVar3 = lVar27 + 1 + lVar31;
                        if ((int)uVar9 <= lVar3) {
                          uVar25 = uVar20 + (int)lVar31 + 1;
                          goto LAB_0014714a;
                        }
                        if (((int)uVar20 < -1) ||
                           ((long)relax_end.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data <= lVar3)) goto LAB_0014783f;
                        lVar3 = lVar31 + 1;
                        lVar10 = lVar31 + 1;
                        lVar31 = lVar3;
                      } while (*(int *)((long)local_110 + (lVar27 + lVar10) * 4) == -1);
                      iVar13 = (int)lVar3;
                      uVar25 = uVar20 + iVar13;
LAB_0014714a:
                      iVar26 = local_44 - uVar20;
                      if (uVar25 != local_44) {
                        iVar26 = iVar13;
                      }
                      internal::SparseLUImpl<double,_int>::panel_dfs
                                ((SparseLUImpl<double,_int> *)local_40,m,iVar26,uVar20,local_158,
                                 &pPVar8->m_indices,&local_8c,(ScalarVector *)&local_a8,
                                 (IndexVector *)
                                 &xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                  .m_storage.m_rows,(IndexVector *)auStack_88,
                                 (IndexVector *)
                                 &panel_lsub.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows,
                                 (IndexVector *)
                                 &relax_end.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows,&local_b8,(IndexVector *)&pivrow,&local_120,glu);
                      internal::SparseLUImpl<double,_int>::panel_bmod
                                ((SparseLUImpl<double,_int> *)this_01,m,iVar26,(int)othersize,
                                 local_8c,(ScalarVector *)&local_a8,(ScalarVector *)&local_c8,
                                 (IndexVector *)auStack_88,
                                 (IndexVector *)
                                 &panel_lsub.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows,glu);
                      piVar30 = piStack_58;
                      uVar20 = iVar26 + (int)othersize;
                      bVar12 = 0 < iVar26;
                      pSVar28 = local_40;
                      if (0 < iVar26) {
                        local_170 = (long)(int)othersize;
                        local_168 = (long)(int)uVar20;
                        local_134 = uVar20;
                        do {
                          uVar21 = (lVar27 - local_170) * uVar29;
                          local_5c = local_8c;
                          local_31 = bVar12;
                          if ((((long)(uVar21 | (ulong)piVar30) < 0) ||
                              ((long)panel_lsub.
                                     super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data - (long)piVar30 < (long)uVar21)) ||
                             ((long)piVar15 - (long)piVar30 < (long)uVar21)) {
LAB_00147883:
                            pcVar23 = 
                            "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                            ;
LAB_001478af:
                            __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                                          ,0x8d,pcVar23);
                          }
                          lVar31 = uVar21 * 4 +
                                   panel_lsub.
                                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                          local_298._8_8_ = piVar30;
                          local_298._0_8_ =
                               xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows + uVar21 * 4;
                          local_278._8_8_ = piVar30;
                          local_278._0_8_ = lVar31;
                          iVar26 = (int)lVar27;
                          iVar13 = internal::SparseLUImpl<double,_int>::column_dfs
                                             ((SparseLUImpl<double,_int> *)local_40,m,iVar26,
                                              &pPVar8->m_indices,(local_40->m_perfv).maxsuper,
                                              &local_5c,(BlockIndexVector *)local_298,
                                              (IndexVector *)auStack_88,
                                              (BlockIndexVector *)local_278,
                                              (IndexVector *)
                                              &relax_end.
                                               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_rows,&local_b8,(IndexVector *)&pivrow,
                                              &local_120,glu);
                          pSVar28 = local_40;
                          if (iVar13 != 0) {
                            std::__cxx11::string::_M_replace
                                      ((ulong)psVar1,0,
                                       (char *)(local_40->m_lastError)._M_string_length,0x19d3c2);
                            goto LAB_001475fb;
                          }
                          if (local_a8.m_rows - (long)piVar30 < (long)uVar21) {
                            pcVar23 = 
                            "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                            ;
                            goto LAB_001478af;
                          }
                          uVar17 = (ulong)local_8c;
                          uVar16 = (long)piVar30 - uVar17;
                          if ((int)uVar16 < 0 && _auStack_88 + uVar17 != (int *)0x0) {
                            __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                                          ,0x94,
                                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 0]"
                                         );
                          }
                          if (((long)(uVar16 | uVar17) < 0) ||
                             ((long)((long)segrep.
                                           super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data - uVar16) < (long)uVar17))
                          goto LAB_00147883;
                          pdVar18 = local_a8.m_data + uVar21;
                          piStack_250 = piVar30;
                          local_258 = pdVar18;
                          uStack_230 = uVar16;
                          local_238 = _auStack_88 + uVar17;
                          local_218._8_8_ = piVar30;
                          local_218._0_8_ = lVar31;
                          iVar13 = internal::SparseLUImpl<double,_int>::column_bmod
                                             ((SparseLUImpl<double,_int> *)local_40,iVar26,
                                              local_5c - local_8c,(BlockScalarVector *)&local_258,
                                              (ScalarVector *)&local_c8,
                                              (BlockIndexVector *)&local_238,
                                              (BlockIndexVector *)local_218,(int)othersize,glu);
                          pSVar28 = local_40;
                          if (iVar13 != 0) {
                            std::__cxx11::string::_M_replace
                                      ((ulong)psVar1,0,
                                       (char *)(local_40->m_lastError)._M_string_length,0x19d3eb);
LAB_001475fb:
                            pSVar28->m_info = NumericalIssue;
                            pSVar28->m_factorizationIsOk = false;
LAB_001476b1:
                            uVar20 = (uint)othersize;
                            bVar12 = local_31;
                            break;
                          }
                          local_1f8._8_8_ = piVar30;
                          local_1f8._0_8_ = lVar31;
                          piStack_1d0 = piVar30;
                          local_1d8 = pdVar18;
                          iVar13 = internal::SparseLUImpl<double,_int>::copy_to_ucol
                                             ((SparseLUImpl<double,_int> *)local_40,iVar26,local_5c,
                                              (IndexVector *)auStack_88,
                                              (BlockIndexVector *)local_1f8,&pPVar8->m_indices,
                                              (BlockScalarVector *)&local_1d8,glu);
                          pSVar28 = local_40;
                          if (iVar13 != 0) {
                            std::__cxx11::string::_M_replace
                                      ((ulong)psVar1,0,
                                       (char *)(local_40->m_lastError)._M_string_length,0x19d415);
                            goto LAB_001475fb;
                          }
                          iVar13 = internal::SparseLUImpl<double,_int>::pivotL
                                             ((SparseLUImpl<double,_int> *)local_40,iVar26,local_160
                                              ,&pPVar8->m_indices,(IndexVector *)local_1a0,
                                              &local_138,glu);
                          pSVar28 = local_40;
                          if (iVar13 != 0) {
                            std::__cxx11::string::_M_replace
                                      ((ulong)psVar1,0,
                                       (char *)(local_40->m_lastError)._M_string_length,0x19d440);
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
                            std::ostream::operator<<((ostringstream *)local_410,iVar13);
                            std::__cxx11::stringbuf::str();
                            std::__cxx11::string::_M_append
                                      ((char *)psVar1,
                                       iperm_c.m_indices.
                                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                       m_storage.m_rows);
                            if ((undefined1 *)
                                iperm_c.m_indices.
                                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows != local_180) {
                              operator_delete((void *)iperm_c.m_indices.
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                            }
                            pSVar28->m_info = NumericalIssue;
                            pSVar28->m_factorizationIsOk = false;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
                            std::ios_base::~ios_base(local_3a0);
                            goto LAB_001476b1;
                          }
                          if (local_138 != iVar26) {
                            local_40->m_detPermR = -local_40->m_detPermR;
                          }
                          local_1b8._8_8_ = piVar30;
                          local_1b8._0_8_ = lVar31;
                          internal::SparseLUImpl<double,_int>::pruneL
                                    ((SparseLUImpl<double,_int> *)local_40,iVar26,&pPVar8->m_indices
                                     ,local_138,local_5c,(IndexVector *)auStack_88,
                                     (BlockIndexVector *)local_1b8,
                                     (IndexVector *)
                                     &relax_end.
                                      super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                      m_storage.m_rows,glu);
                          if (0 < local_5c) {
                            piVar22 = segrep.
                                      super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                      m_storage.m_data;
                            if ((long)segrep.
                                      super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                      m_storage.m_data < 1) {
                              piVar22 = (int *)0x0;
                            }
                            piVar24 = (int *)0x0;
                            do {
                              if (piVar22 == piVar24) goto LAB_0014783f;
                              if (m <= (uint)_auStack_88[(long)piVar24]) {
                                pcVar23 = 
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 1]"
                                ;
                                goto LAB_00147854;
                              }
                              *(undefined4 *)(lVar31 + (long)_auStack_88[(long)piVar24] * 4) =
                                   0xffffffff;
                              piVar24 = (int *)((long)piVar24 + 1);
                            } while ((long)piVar24 < (long)local_5c);
                          }
                          lVar27 = lVar27 + 1;
                          bVar12 = lVar27 < local_168;
                          pSVar28 = local_40;
                          uVar20 = local_134;
                        } while (lVar27 < local_168);
                      }
                      uVar25 = local_44;
                    } while ((bVar12 & 1) == 0);
                    free((void *)segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows);
                    free((void *)local_110);
                    free((void *)local_1a0);
                    free(local_c8.m_data);
                    free(local_a8.m_data);
                    free(local_b8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data);
                    free((void *)relax_end.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows);
                    free((void *)xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows);
                    free((void *)panel_lsub.
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows);
                    free(local_120.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data);
                    free(_pivrow);
                    free(_auStack_88);
                    return;
                  }
                }
LAB_0014783f:
                pcVar23 = 
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                ;
LAB_00147854:
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x18a,pcVar23);
              }
            }
          }
        }
LAB_0014794c:
        __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x3f,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                     );
      }
    }
  }
  __assert_fail("dim >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                ,0xe1,
                "Eigen::Matrix<int, -1, 1>::Matrix(Index) [_Scalar = int, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
               );
}

Assistant:

void SparseLU<MatrixType, OrderingType>::factorize(const MatrixType& matrix)
{
  using internal::emptyIdxLU;
  eigen_assert(m_analysisIsOk && "analyzePattern() should be called first"); 
  eigen_assert((matrix.rows() == matrix.cols()) && "Only for squared matrices");
  
  typedef typename IndexVector::Scalar Index; 
  
  
  // Apply the column permutation computed in analyzepattern()
  //   m_mat = matrix * m_perm_c.inverse(); 
  m_mat = matrix;
  if (m_perm_c.size()) 
  {
    m_mat.uncompress(); //NOTE: The effect of this command is only to create the InnerNonzeros pointers.
    //Then, permute only the column pointers
    const Index * outerIndexPtr;
    if (matrix.isCompressed()) outerIndexPtr = matrix.outerIndexPtr();
    else
    {
      Index* outerIndexPtr_t = new Index[matrix.cols()+1];
      for(Index i = 0; i <= matrix.cols(); i++) outerIndexPtr_t[i] = m_mat.outerIndexPtr()[i];
      outerIndexPtr = outerIndexPtr_t;
    }
    for (Index i = 0; i < matrix.cols(); i++)
    {
      m_mat.outerIndexPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i];
      m_mat.innerNonZeroPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i+1] - outerIndexPtr[i];
    }
    if(!matrix.isCompressed()) delete[] outerIndexPtr;
  } 
  else 
  { //FIXME This should not be needed if the empty permutation is handled transparently
    m_perm_c.resize(matrix.cols());
    for(Index i = 0; i < matrix.cols(); ++i) m_perm_c.indices()(i) = i;
  }
  
  Index m = m_mat.rows();
  Index n = m_mat.cols();
  Index nnz = m_mat.nonZeros();
  Index maxpanel = m_perfv.panel_size * m;
  // Allocate working storage common to the factor routines
  Index lwork = 0;
  Index info = Base::memInit(m, n, nnz, lwork, m_perfv.fillfactor, m_perfv.panel_size, m_glu); 
  if (info) 
  {
    m_lastError = "UNABLE TO ALLOCATE WORKING MEMORY\n\n" ;
    m_factorizationIsOk = false;
    return ; 
  }
  
  // Set up pointers for integer working arrays 
  IndexVector segrep(m); segrep.setZero();
  IndexVector parent(m); parent.setZero();
  IndexVector xplore(m); xplore.setZero();
  IndexVector repfnz(maxpanel);
  IndexVector panel_lsub(maxpanel);
  IndexVector xprune(n); xprune.setZero();
  IndexVector marker(m*internal::LUNoMarker); marker.setZero();
  
  repfnz.setConstant(-1); 
  panel_lsub.setConstant(-1);
  
  // Set up pointers for scalar working arrays 
  ScalarVector dense; 
  dense.setZero(maxpanel);
  ScalarVector tempv; 
  tempv.setZero(internal::LUnumTempV(m, m_perfv.panel_size, m_perfv.maxsuper, /*m_perfv.rowblk*/m) );
  
  // Compute the inverse of perm_c
  PermutationType iperm_c(m_perm_c.inverse()); 
  
  // Identify initial relaxed snodes
  IndexVector relax_end(n);
  if ( m_symmetricmode == true ) 
    Base::heap_relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  else
    Base::relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  
  
  m_perm_r.resize(m); 
  m_perm_r.indices().setConstant(-1);
  marker.setConstant(-1);
  m_detPermR = 1; // Record the determinant of the row permutation
  
  m_glu.supno(0) = emptyIdxLU; m_glu.xsup.setConstant(0);
  m_glu.xsup(0) = m_glu.xlsub(0) = m_glu.xusub(0) = m_glu.xlusup(0) = Index(0);
  
  // Work on one 'panel' at a time. A panel is one of the following :
  //  (a) a relaxed supernode at the bottom of the etree, or
  //  (b) panel_size contiguous columns, <panel_size> defined by the user
  Index jcol; 
  IndexVector panel_histo(n);
  Index pivrow; // Pivotal row number in the original row matrix
  Index nseg1; // Number of segments in U-column above panel row jcol
  Index nseg; // Number of segments in each U-column 
  Index irep; 
  Index i, k, jj; 
  for (jcol = 0; jcol < n; )
  {
    // Adjust panel size so that a panel won't overlap with the next relaxed snode. 
    Index panel_size = m_perfv.panel_size; // upper bound on panel width
    for (k = jcol + 1; k < (std::min)(jcol+panel_size, n); k++)
    {
      if (relax_end(k) != emptyIdxLU) 
      {
        panel_size = k - jcol; 
        break; 
      }
    }
    if (k == n) 
      panel_size = n - jcol; 
      
    // Symbolic outer factorization on a panel of columns 
    Base::panel_dfs(m, panel_size, jcol, m_mat, m_perm_r.indices(), nseg1, dense, panel_lsub, segrep, repfnz, xprune, marker, parent, xplore, m_glu); 
    
    // Numeric sup-panel updates in topological order 
    Base::panel_bmod(m, panel_size, jcol, nseg1, dense, tempv, segrep, repfnz, m_glu); 
    
    // Sparse LU within the panel, and below the panel diagonal 
    for ( jj = jcol; jj< jcol + panel_size; jj++) 
    {
      k = (jj - jcol) * m; // Column index for w-wide arrays 
      
      nseg = nseg1; // begin after all the panel segments
      //Depth-first-search for the current column
      VectorBlock<IndexVector> panel_lsubk(panel_lsub, k, m);
      VectorBlock<IndexVector> repfnz_k(repfnz, k, m); 
      info = Base::column_dfs(m, jj, m_perm_r.indices(), m_perfv.maxsuper, nseg, panel_lsubk, segrep, repfnz_k, xprune, marker, parent, xplore, m_glu); 
      if ( info ) 
      {
        m_lastError =  "UNABLE TO EXPAND MEMORY IN COLUMN_DFS() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      // Numeric updates to this column 
      VectorBlock<ScalarVector> dense_k(dense, k, m); 
      VectorBlock<IndexVector> segrep_k(segrep, nseg1, m-nseg1); 
      info = Base::column_bmod(jj, (nseg - nseg1), dense_k, tempv, segrep_k, repfnz_k, jcol, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COLUMN_BMOD() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Copy the U-segments to ucol(*)
      info = Base::copy_to_ucol(jj, nseg, segrep, repfnz_k ,m_perm_r.indices(), dense_k, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COPY_TO_UCOL() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Form the L-segment 
      info = Base::pivotL(jj, m_diagpivotthresh, m_perm_r.indices(), iperm_c.indices(), pivrow, m_glu);
      if ( info ) 
      {
        m_lastError = "THE MATRIX IS STRUCTURALLY SINGULAR ... ZERO COLUMN AT ";
        std::ostringstream returnInfo;
        returnInfo << info; 
        m_lastError += returnInfo.str();
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Update the determinant of the row permutation matrix
      if (pivrow != jj) m_detPermR *= -1;

      // Prune columns (0:jj-1) using column jj
      Base::pruneL(jj, m_perm_r.indices(), pivrow, nseg, segrep, repfnz_k, xprune, m_glu); 
      
      // Reset repfnz for this column 
      for (i = 0; i < nseg; i++)
      {
        irep = segrep(i); 
        repfnz_k(irep) = emptyIdxLU; 
      }
    } // end SparseLU within the panel  
    jcol += panel_size;  // Move to the next panel
  } // end for -- end elimination 
  
  // Count the number of nonzeros in factors 
  Base::countnz(n, m_nnzL, m_nnzU, m_glu); 
  // Apply permutation  to the L subscripts 
  Base::fixupL(n, m_perm_r.indices(), m_glu); 
  
  // Create supernode matrix L 
  m_Lstore.setInfos(m, n, m_glu.lusup, m_glu.xlusup, m_glu.lsub, m_glu.xlsub, m_glu.supno, m_glu.xsup); 
  // Create the column major upper sparse matrix  U; 
  new (&m_Ustore) MappedSparseMatrix<Scalar, ColMajor, Index> ( m, n, m_nnzU, m_glu.xusub.data(), m_glu.usub.data(), m_glu.ucol.data() ); 
  
  m_info = Success;
  m_factorizationIsOk = true;
}